

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.hpp
# Opt level: O3

string_view __thiscall cinatra::http_parser::get_boundary(http_parser *this)

{
  long lVar1;
  size_type sVar2;
  size_t sVar3;
  string_view key;
  string_view sVar4;
  string_view content_type;
  string_view local_18;
  
  key._M_str = "Content-Type";
  key._M_len = 0xc;
  local_18 = get_header_value(this,key);
  sVar3 = 0;
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find(&local_18,"=--",0,3);
  if (sVar2 == 0xffffffffffffffff) {
    local_18._M_str = "";
  }
  else {
    lVar1 = sVar2 + 1;
    if (local_18._M_len <= sVar2) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                 lVar1,local_18._M_len);
    }
    sVar3 = local_18._M_len - lVar1;
    local_18._M_str = local_18._M_str + lVar1;
  }
  sVar4._M_str = local_18._M_str;
  sVar4._M_len = sVar3;
  return sVar4;
}

Assistant:

std::string_view get_boundary() {
    auto content_type = get_header_value("Content-Type");
    size_t pos = content_type.find("=--");
    if (pos == std::string_view::npos) {
      return "";
    }

    return content_type.substr(pos + 1);
  }